

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

void __thiscall slang::ast::UnrollVisitor::runForReal(UnrollVisitor *this,ForLoopStatement *loop)

{
  IntervalMap<unsigned_long,_std::monostate,_0U> *this_00;
  Path *this_01;
  SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *pSVar1;
  ValueSymbol *this_02;
  undefined1 auVar2 [16];
  bool bVar3;
  Symbol *args_2;
  undefined8 *puVar4;
  ValueDriver *driver;
  EVP_PKEY_CTX *ctx;
  undefined8 *puVar5;
  pair<unsigned_long,_unsigned_long> bounds;
  iterator __begin3_1;
  iterator __begin3;
  iterator local_c0;
  undefined1 local_b0 [8];
  Path local_a8;
  iterator local_70;
  
  this->anyErrors = false;
  this->setupMode = false;
  EvalContext::reset(&this->evalCtx);
  EvalContext::pushEmptyFrame(&this->evalCtx);
  ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false>::
  visit<slang::ast::ForLoopStatement>
            ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false> *)this,loop);
  if (this->anyErrors == true) {
    _local_b0 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
                ::begin(&(this->driverMap).table_);
    while (local_a8.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
           (pointer)0x0) {
      Expression::requireLValue
                (((AssignmentExpression *)
                 (local_a8.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)
                 ->node)->left_,this->astCtx,(SourceLocation)0x0,
                 (bitmask<slang::ast::AssignFlags>)
                 (underlying_type)
                 *(undefined4 *)
                  &((AssignmentExpression *)
                   (local_a8.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   data_)->node)->nonBlocking,(Expression *)0x0);
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   *)local_b0);
    }
  }
  else {
    args_2 = ASTContext::getContainingSymbol(this->astCtx);
    local_c0 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
               ::begin(&(this->driverMap).table_);
    this_01 = &local_70.super_const_iterator.path;
    while (local_c0.p_ != (table_element_pointer)0x0) {
      pSVar1 = ((local_c0.p_)->second)._M_t.
               super___uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
               .
               super__Head_base<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_false>
               ._M_head_impl;
      puVar5 = &(((pSVar1->super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>).
                 data_)->longestStaticPrefix).ptr;
      puVar4 = puVar5 + (pSVar1->
                        super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>).len
                        * 0x1c;
      for (; puVar5 != puVar4; puVar5 = puVar5 + 0x1c) {
        auVar2[0xf] = 0;
        auVar2._0_15_ = stack0xffffffffffffff51;
        _local_b0 = (iterator)(auVar2 << 8);
        local_70.super_const_iterator.map._0_1_ = 0;
        driver = BumpAllocator::
                 emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::Expression_const&,slang::ast::Symbol_const&,slang::ast::AssignFlags>
                           (&this->comp->super_BumpAllocator,(DriverKind *)local_b0,
                            (Expression *)*puVar5,args_2,(AssignFlags *)&local_70);
        this_00 = (IntervalMap<unsigned_long,_std::monostate,_0U> *)(puVar5 + 3);
        IntervalMap<unsigned_long,_std::monostate,_0U>::begin((iterator *)local_b0,this_00);
        while( true ) {
          IntervalMap<unsigned_long,_std::monostate,_0U>::end(&local_70,this_00);
          ctx = (EVP_PKEY_CTX *)this_01;
          bVar3 = IntervalMapDetails::Path::operator==(&local_a8,this_01);
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_01,ctx);
          if (bVar3) break;
          this_02 = (ValueSymbol *)puVar5[1];
          bounds = IntervalMap<unsigned_long,_std::monostate,_0U>::const_iterator::bounds
                             ((const_iterator *)local_b0);
          ValueSymbol::addDriver(this_02,bounds,driver);
          IntervalMap<unsigned_long,_std::monostate,_0U>::const_iterator::operator++
                    ((const_iterator *)local_b0);
        }
        SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                  ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_a8,ctx);
        IntervalMap<unsigned_long,_std::monostate,_0U>::clear
                  (this_00,&this->comp->unrollIntervalMapAllocator);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment(&local_c0);
    }
  }
  return;
}

Assistant:

void runForReal(const ForLoopStatement& loop) {
        // Revisit the loop with setupMode turned off.
        anyErrors = false;
        setupMode = false;
        evalCtx.reset();
        evalCtx.pushEmptyFrame();
        visit(loop);

        if (anyErrors) {
            // We can't correctly apply our collected intervals if there are errors,
            // so just visit each assignment expression like normal to make sure
            // errors get issued.
            for (auto& [expr, stateVec] : driverMap) {
                auto flags = expr->isNonBlocking() ? AssignFlags::NonBlocking : AssignFlags::None;
                expr->left().requireLValue(astCtx, {}, flags);
            }
        }
        else {
            // Find our finished driver interval maps and apply them.
            auto& containingSym = astCtx.getContainingSymbol();
            for (auto& [expr, stateVec] : driverMap) {
                for (auto& state : *stateVec) {
                    auto driver = comp.emplace<ValueDriver>(DriverKind::Procedural,
                                                            *state.longestStaticPrefix,
                                                            containingSym, AssignFlags::None);

                    for (auto it = state.intervals.begin(); it != state.intervals.end(); ++it)
                        state.symbol->addDriver(it.bounds(), *driver);

                    state.intervals.clear(comp.getUnrollIntervalMapAllocator());
                }
            }
        }
    }